

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O2

PointerReader * __thiscall
capnp::anon_unknown_0::MembraneCapTableReader::imbue
          (PointerReader *__return_storage_ptr__,MembraneCapTableReader *this,PointerReader reader)

{
  CapTableReader *pCVar1;
  Fault f;
  DebugComparison<capnp::_::CapTableReader_*&,_std::nullptr_t> _kjCondition;
  
  _kjCondition.left = &this->inner;
  _kjCondition.right = (void *)0x0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = this->inner == (CapTableReader *)0x0;
  if (_kjCondition.result) {
    pCVar1 = capnp::_::PointerReader::getCapTable(&reader);
    this->inner = pCVar1;
    capnp::_::PointerReader::imbue(__return_storage_ptr__,&reader,&this->super_CapTableReader);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::CapTableReader*&,decltype(nullptr)>&,char_const(&)[24]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane.c++"
             ,0x2d,FAILED,"inner == nullptr","_kjCondition,\"can only call this once\"",
             &_kjCondition,(char (*) [24])"can only call this once");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

_::PointerReader imbue(_::PointerReader reader) {
    KJ_REQUIRE(inner == nullptr, "can only call this once");
    inner = reader.getCapTable();
    return reader.imbue(this);
  }